

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::LogQueryPathSetting::SetLocal(ClientContext *context,Value *input)

{
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var1;
  ClientData *pCVar2;
  FileSystem *args;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var3;
  string path;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> local_48;
  string local_40;
  
  pCVar2 = ClientData::Get(context);
  Value::ToString_abi_cxx11_(&local_40,input);
  if (local_40._M_string_length == 0) {
    _Var3._M_head_impl =
         (pCVar2->log_query_writer).
         super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
         .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
    (pCVar2->log_query_writer).
    super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
    .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl =
         (BufferedFileWriter *)0x0;
  }
  else {
    args = FileSystem::GetFileSystem(context);
    make_uniq<duckdb::BufferedFileWriter,duckdb::FileSystem&,std::__cxx11::string&,duckdb::FileOpenFlags_const&>
              ((duckdb *)&local_48,args,&local_40,
               (FileOpenFlags *)BufferedFileWriter::DEFAULT_OPEN_FLAGS);
    _Var1._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (BufferedFileWriter *)0x0;
    _Var3._M_head_impl =
         (pCVar2->log_query_writer).
         super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
         .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
    (pCVar2->log_query_writer).
    super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
    .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (_Var3._M_head_impl == (BufferedFileWriter *)0x0) goto LAB_019af2c2;
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_WriteStream + 0x10))();
    _Var3._M_head_impl = local_48._M_head_impl;
  }
  if (_Var3._M_head_impl != (BufferedFileWriter *)0x0) {
    (*((_Var3._M_head_impl)->super_WriteStream)._vptr_WriteStream[2])();
  }
LAB_019af2c2:
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void LogQueryPathSetting::SetLocal(ClientContext &context, const Value &input) {
	auto &client_data = ClientData::Get(context);
	auto path = input.ToString();
	if (path.empty()) {
		// empty path: clean up query writer
		client_data.log_query_writer = nullptr;
	} else {
		client_data.log_query_writer = make_uniq<BufferedFileWriter>(FileSystem::GetFileSystem(context), path,
		                                                             BufferedFileWriter::DEFAULT_OPEN_FLAGS);
	}
}